

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifestuff.cpp
# Opt level: O1

int AF_A_GetHurt(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  byte *pbVar1;
  VM_UBYTE VVar2;
  AActor *ent;
  undefined8 *puVar3;
  PClass *pPVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined8 uVar7;
  PClass *pPVar8;
  AActor *pAVar9;
  VMValue *pVVar10;
  AActor *pAVar11;
  char *__assertion;
  bool bVar12;
  FSoundID local_2c;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005d5d33;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    ent = (AActor *)(param->field_0).field_1.a;
    pVVar10 = param;
    uVar6 = numparam;
    if (ent != (AActor *)0x0) {
      if ((ent->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar5 = (**(ent->super_DThinker).super_DObject._vptr_DObject)(ent);
        (ent->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar5);
      }
      pPVar8 = (ent->super_DThinker).super_DObject.Class;
      bVar12 = pPVar8 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar12;
      uVar6 = (uint)bVar12;
      pVVar10 = (VMValue *)(ulong)(pPVar8 == pPVar4 || bVar12);
      if (pPVar8 != pPVar4 && !bVar12) {
        do {
          pPVar8 = pPVar8->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar8 != (PClass *)0x0);
          if (pPVar8 == pPVar4) break;
        } while (pPVar8 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005d5d33;
      }
    }
    pPVar4 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar2 = param[1].field_0.field_3.Type, VVar2 != 0xff)) {
      if ((VVar2 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005d5d08;
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar7 = (**(code **)*puVar3)(puVar3,pVVar10,uVar6,ret);
          puVar3[1] = uVar7;
        }
        pPVar8 = (PClass *)puVar3[1];
        bVar12 = pPVar8 != (PClass *)0x0;
        if (pPVar8 != pPVar4 && bVar12) {
          do {
            pPVar8 = pPVar8->ParentClass;
            bVar12 = pPVar8 != (PClass *)0x0;
            if (pPVar8 == pPVar4) break;
          } while (pPVar8 != (PClass *)0x0);
        }
        if (!bVar12) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005d5d33;
        }
      }
    }
    if (((numparam < 3) || (VVar2 = param[2].field_0.field_3.Type, VVar2 == 0xff)) ||
       ((VVar2 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      pbVar1 = (byte *)((long)&(ent->flags4).Value + 1);
      *pbVar1 = *pbVar1 | 0x80;
      uVar6 = FRandom::GenRand32(&pr_gethurt);
      if ((uVar6 & 0xff) * -0x33333333 < 0x33333334) {
        local_2c.ID = (ent->PainSound).super_FSoundID.ID;
        S_Sound(ent,2,&local_2c,1.0,1.0);
        ent->health = ent->health + -1;
      }
      if (ent->health < 1) {
        pAVar11 = (ent->target).field_0.p;
        if ((pAVar11 != (AActor *)0x0) &&
           (((pAVar11->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
          (ent->target).field_0.p = (AActor *)0x0;
          pAVar11 = (AActor *)0x0;
        }
        pAVar9 = (ent->target).field_0.p;
        if ((pAVar9 != (AActor *)0x0) &&
           (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
          (ent->target).field_0.p = (AActor *)0x0;
          pAVar9 = (AActor *)0x0;
        }
        (*(ent->super_DThinker).super_DObject._vptr_DObject[0xf])(ent,pAVar11,pAVar9,0);
      }
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005d5d08:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005d5d33:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifestuff.cpp"
                ,0x6f,"int AF_A_GetHurt(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_GetHurt)
{
	PARAM_ACTION_PROLOGUE;

	self->flags4 |= MF4_INCOMBAT;
	if ((pr_gethurt() % 5) == 0)
	{
		S_Sound (self, CHAN_VOICE, self->PainSound, 1, ATTN_NORM);
		self->health--;
	}
	if (self->health <= 0)
	{
		self->Die (self->target, self->target);
	}
	return 0;
}